

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O1

nh_roles_info * nh_get_roles(void)

{
  char *pcVar1;
  boolean bVar2;
  nh_roles_info *pnVar3;
  char **ppcVar4;
  char **ppcVar5;
  nh_bool *__s;
  short *psVar6;
  int iVar7;
  ulong uVar8;
  ushort uVar9;
  char **ppcVar10;
  Race *pRVar11;
  Gender *pGVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  short *psVar17;
  ulong uVar18;
  bool bVar19;
  
  pnVar3 = (nh_roles_info *)xmalloc(0x50);
  pnVar3->num_roles = 0xe;
  pnVar3->num_races = 6;
  pnVar3->num_genders = 2;
  pnVar3->num_aligns = 3;
  ppcVar4 = (char **)xmalloc(0x70);
  ppcVar5 = (char **)xmalloc(pnVar3->num_roles << 3);
  iVar7 = pnVar3->num_roles;
  if (0 < (long)iVar7) {
    ppcVar10 = &roles[0].name.f;
    lVar14 = 0;
    do {
      pcVar1 = *ppcVar10;
      ppcVar4[lVar14] = ((RoleName *)(ppcVar10 + -1))->m;
      ppcVar5[lVar14] = pcVar1;
      lVar14 = lVar14 + 1;
      ppcVar10 = ppcVar10 + 0x23;
    } while (iVar7 != lVar14);
  }
  pnVar3->rolenames_m = ppcVar4;
  pnVar3->rolenames_f = ppcVar5;
  ppcVar4 = (char **)xmalloc(pnVar3->num_races << 3);
  iVar7 = pnVar3->num_races;
  if (0 < (long)iVar7) {
    pRVar11 = races;
    lVar14 = 0;
    do {
      ppcVar4[lVar14] = pRVar11->noun;
      lVar14 = lVar14 + 1;
      pRVar11 = pRVar11 + 1;
    } while (iVar7 != lVar14);
  }
  pnVar3->racenames = ppcVar4;
  ppcVar4 = (char **)xmalloc(pnVar3->num_genders << 3);
  iVar7 = pnVar3->num_genders;
  if (0 < (long)iVar7) {
    pGVar12 = genders;
    lVar14 = 0;
    do {
      ppcVar4[lVar14] = pGVar12->adj;
      lVar14 = lVar14 + 1;
      pGVar12 = pGVar12 + 1;
    } while (iVar7 != lVar14);
  }
  pnVar3->gendnames = ppcVar4;
  ppcVar4 = (char **)xmalloc(pnVar3->num_aligns << 3);
  iVar7 = pnVar3->num_aligns;
  if (0 < (long)iVar7) {
    lVar14 = 0;
    do {
      *(undefined8 *)((long)ppcVar4 + lVar14) = *(undefined8 *)((long)&aligns[0].adj + lVar14 * 4);
      lVar14 = lVar14 + 8;
    } while ((long)iVar7 * 8 - lVar14 != 0);
  }
  pnVar3->alignnames = ppcVar4;
  pnVar3->def_role = flags.init_role;
  pnVar3->def_race = flags.init_race;
  pnVar3->def_gend = flags.init_gend;
  pnVar3->def_align = flags.init_align;
  iVar7 = iVar7 * pnVar3->num_roles * pnVar3->num_races * pnVar3->num_genders;
  __s = (nh_bool *)xmalloc(iVar7);
  memset(__s,0,(long)iVar7);
  if (0 < pnVar3->num_roles) {
    uVar18 = 0;
    do {
      if (0 < pnVar3->num_races) {
        psVar17 = &roles[uVar18].allow;
        uVar16 = 0;
        do {
          bVar2 = ok_race((int)uVar18,(int)uVar16,-1,-1);
          if ((bVar2 != '\0') && (0 < pnVar3->num_genders)) {
            psVar6 = &races[uVar16].allow;
            uVar8 = 0;
            do {
              if (uVar8 < 2) {
                uVar9 = genders[uVar8].allow;
                if (uVar18 < 0xe) {
                  uVar9 = uVar9 & *psVar17;
                }
                if (uVar16 < 6) {
                  uVar9 = uVar9 & *psVar6;
                }
                if ((0xfff < uVar9) &&
                   (uVar15 = (ulong)(uint)pnVar3->num_aligns, 0 < pnVar3->num_aligns)) {
                  uVar13 = 0;
                  do {
                    if (uVar13 < 3) {
                      uVar9 = aligns[uVar13].allow;
                      if (uVar18 < 0xe) {
                        uVar9 = uVar9 & *psVar17;
                      }
                      if (uVar16 < 6) {
                        uVar9 = uVar9 & *psVar6;
                      }
                      bVar19 = (uVar9 & 7) != 0;
                    }
                    else {
                      lVar14 = 0x38;
                      do {
                        uVar9 = *(ushort *)(races[0].attrmin + lVar14 + -0x40);
                        if (uVar18 < 0xe) {
                          uVar9 = uVar9 & *psVar17;
                        }
                        if (uVar16 < 6) {
                          uVar9 = uVar9 & *psVar6;
                        }
                        if ((uVar9 & 7) != 0) {
                          bVar19 = true;
                          goto LAB_00234d0c;
                        }
                        lVar14 = lVar14 + 0x58;
                      } while (lVar14 != 0x140);
                      bVar19 = false;
                    }
LAB_00234d0c:
                    __s[(int)uVar13 +
                        ((pnVar3->num_races * (int)uVar18 + (int)uVar16) * pnVar3->num_genders +
                        (int)uVar8) * (int)uVar15] = bVar19;
                    uVar13 = uVar13 + 1;
                    uVar15 = (ulong)pnVar3->num_aligns;
                  } while ((long)uVar13 < (long)uVar15);
                }
              }
              uVar8 = uVar8 + 1;
            } while ((long)uVar8 < (long)pnVar3->num_genders);
          }
          uVar16 = uVar16 + 1;
        } while ((long)uVar16 < (long)pnVar3->num_races);
      }
      uVar18 = uVar18 + 1;
    } while ((long)uVar18 < (long)pnVar3->num_roles);
  }
  pnVar3->matrix = __s;
  return pnVar3;
}

Assistant:

struct nh_roles_info *nh_get_roles(void)
{
	int i, rolenum, racenum, gendnum, alignnum, arrsize;
	struct nh_roles_info *info = xmalloc(sizeof(struct nh_roles_info));
	const char **names, **names2;
	nh_bool *tmpmatrix;
	
	/* number of choices */
	for (i = 0; roles[i].name.m; i++);
	info->num_roles = i;
	
	for (i = 0; races[i].noun; i++);
	info->num_races = i;
	
	info->num_genders = ROLE_GENDERS;
	info->num_aligns = ROLE_ALIGNS;
	
	/* names of choices */
	names = xmalloc(info->num_roles * sizeof(char*));
	names2 = xmalloc(info->num_roles * sizeof(char*));
	for (i = 0; i < info->num_roles; i++) {
	    names[i]  = roles[i].name.m;
	    names2[i] = roles[i].name.f;
	}
	info->rolenames_m = names;
	info->rolenames_f = names2;

	names = xmalloc(info->num_races * sizeof(char*));
	for (i = 0; i < info->num_races; i++)
	    names[i] = races[i].noun;
	info->racenames = names;
	
	names = xmalloc(info->num_genders * sizeof(char*));
	for (i = 0; i < info->num_genders; i++)
	    names[i] = genders[i].adj;
	info->gendnames = names;
	
	names = xmalloc(info->num_aligns * sizeof(char*));
	for (i = 0; i < info->num_aligns; i++)
	    names[i] = aligns[i].adj;
	info->alignnames = names;
	
	/* default choices */
	info->def_role = flags.init_role;
	info->def_race = flags.init_race;
	info->def_gend = flags.init_gend;
	info->def_align = flags.init_align;
	
	/* valid combinations of choices */
	arrsize = info->num_roles * info->num_races * info->num_genders * info->num_aligns;
	tmpmatrix = xmalloc(arrsize * sizeof(nh_bool));
	memset(tmpmatrix, FALSE, arrsize * sizeof(nh_bool));
	for (rolenum = 0; rolenum < info->num_roles; rolenum++) {
	    for (racenum = 0; racenum < info->num_races; racenum++) {
		if (!ok_race(rolenum, racenum, ROLE_NONE, ROLE_NONE))
		    continue;
		for (gendnum = 0; gendnum < info->num_genders; gendnum++) {
		    if (!ok_gend(rolenum, racenum, gendnum, ROLE_NONE))
			continue;
		    for (alignnum = 0; alignnum < info->num_aligns; alignnum++) {
			tmpmatrix[nh_cm_idx((*info), rolenum, racenum, gendnum, alignnum)] =
			    ok_align(rolenum, racenum, gendnum, alignnum);
		    }
		}
	    }
	}
	info->matrix = tmpmatrix;
	
	return info;
}